

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface::store
          (ExternalInterface *this,Store *store,Address addr,Literal *value,Name memory)

{
  uint8_t uVar1;
  float fVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  ushort uVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  anon_union_4_2_5fd15f10 fp32_1;
  float fVar7;
  undefined1 local_38 [16];
  
  pcVar6 = memory.super_IString.str._M_str;
  sVar5 = memory.super_IString.str._M_len;
  switch((store->valueType).id) {
  case 0:
  case 1:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0xb56);
  case 2:
    uVar1 = store->bytes;
    if (uVar1 != '\x04') {
      if (uVar1 == '\x02') {
        if ((value->type).id != 2) goto LAB_001b0c5b;
        goto LAB_001b0cab;
      }
      if (uVar1 != '\x01') {
        wasm::handle_unreachable
                  ("invalid store size",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xb25);
      }
      if ((value->type).id != 2) {
LAB_001b0c5b:
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
LAB_001b0b6a:
      uVar4 = (ulong)(uint)(int)(char)(value->field_0).v128[0];
      UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x16];
      goto LAB_001b0cb9;
    }
    if ((value->type).id != 2) goto LAB_001b0c5b;
    break;
  case 3:
    switch(store->bytes) {
    case '\x01':
      if ((value->type).id != 3) goto LAB_001b0d29;
      goto LAB_001b0b6a;
    case '\x02':
      if ((value->type).id != 3) goto LAB_001b0d29;
LAB_001b0cab:
      uVar4 = (ulong)(uint)(int)*(short *)&value->field_0;
      UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x17];
      goto LAB_001b0cb9;
    default:
      wasm::handle_unreachable
                ("invalid store size",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0xb38);
    case '\x04':
      if ((value->type).id != 3) goto LAB_001b0d29;
      break;
    case '\b':
      if ((value->type).id == 3) goto LAB_001b0b18;
LAB_001b0d29:
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    break;
  case 4:
    if (store->bytes != '\x04') {
      if (store->bytes != '\x02') {
        wasm::handle_unreachable
                  ("invalid store size",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xb4a);
      }
      if ((value->type).id != 4) goto LAB_001b0c2c;
      fVar2 = (float)(value->field_0).i32;
      fVar7 = 2.0;
      if (0x70ffffff < (uint)((int)fVar2 * 2)) {
        fVar7 = (float)(((uint)fVar2 & 0x7f800000) + 0x7800000);
      }
      fVar7 = fVar7 + ABS(fVar2) * 5.192297e+33 * 7.70372e-34;
      uVar3 = 0x7e00;
      if ((uint)((int)fVar2 * 2) < 0xff000001) {
        uVar3 = (SUB42(fVar7,0) & 0xfff) + ((ushort)((uint)fVar7 >> 0xd) & 0x7c00);
      }
      UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x17];
      uVar4 = (ulong)(uint)(int)(short)(uVar3 | (ushort)((uint)fVar2 >> 0x10) & 0x8000);
      goto LAB_001b0cb9;
    }
    if ((value->type).id != 4) {
LAB_001b0c2c:
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x14b,"int32_t wasm::Literal::reinterpreti32() const");
    }
    break;
  case 5:
    if ((value->type).id != 5) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x14f,"int64_t wasm::Literal::reinterpreti64() const");
    }
LAB_001b0b18:
    (*this->_vptr_ExternalInterface[0x19])(this,addr.addr,(value->field_0).i64,sVar5,pcVar6);
    return;
  case 6:
    local_38 = wasm::Literal::getv128();
    (*this->_vptr_ExternalInterface[0x1a])(this,addr.addr,local_38,sVar5,pcVar6);
    return;
  default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  uVar4 = (ulong)(uint)(value->field_0).i32;
  UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x18];
LAB_001b0cb9:
  (*UNRECOVERED_JUMPTABLE)(this,addr.addr,uVar4,sVar5,pcVar6);
  return;
}

Assistant:

virtual void store(Store* store, Address addr, Literal value, Name memory) {
      switch (store->valueType.getBasic()) {
        case Type::i32: {
          switch (store->bytes) {
            case 1:
              store8(addr, value.geti32(), memory);
              break;
            case 2:
              store16(addr, value.geti32(), memory);
              break;
            case 4:
              store32(addr, value.geti32(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        case Type::i64: {
          switch (store->bytes) {
            case 1:
              store8(addr, value.geti64(), memory);
              break;
            case 2:
              store16(addr, value.geti64(), memory);
              break;
            case 4:
              store32(addr, value.geti64(), memory);
              break;
            case 8:
              store64(addr, value.geti64(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        // write floats carefully, ensuring all bits reach memory
        case Type::f32: {
          switch (store->bytes) {
            case 2: {
              float f32 = bit_cast<float>(value.reinterpreti32());
              // Convert the float32 to float16 and store the binary
              // representation.
              store16(addr, fp16_ieee_from_fp32_value(f32), memory);
              break;
            }
            case 4:
              store32(addr, value.reinterpreti32(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        case Type::f64:
          store64(addr, value.reinterpreti64(), memory);
          break;
        case Type::v128:
          store128(addr, value.getv128(), memory);
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
    }